

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O2

void __thiscall
wallet::SelectionResult::
InsertInputs<std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
          (SelectionResult *this,
          vector<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
          *inputs)

{
  pointer psVar1;
  pointer psVar2;
  size_t sVar3;
  string_view func;
  runtime_error *this_00;
  long in_FS_OFFSET;
  string_view file;
  string_view msg;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  psVar1 = (inputs->
           super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (inputs->
           super__Vector_base<std::shared_ptr<wallet::COutput>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  sVar3 = (this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  util::
  insert<std::shared_ptr<wallet::COutput>,std::vector<std::shared_ptr<wallet::COutput>,std::allocator<std::shared_ptr<wallet::COutput>>>>
            (&this->m_selected_inputs,inputs);
  if ((this->m_selected_inputs)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
      ((long)psVar1 - (long)psVar2 >> 4) + sVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    func._M_str = "InsertInputs";
    func._M_len = 0xc;
    file._M_str = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.h"
    ;
    file._M_len = 0x66;
    msg._M_str = "Shared UTXOs among selection results";
    msg._M_len = 0x24;
    StrFormatInternalBug_abi_cxx11_(&local_40,msg,file,0x161,func);
    std::runtime_error::runtime_error(this_00,(string *)&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

void InsertInputs(const T& inputs)
    {
        // Store sum of combined input sets to check that the results have no shared UTXOs
        const size_t expected_count = m_selected_inputs.size() + inputs.size();
        util::insert(m_selected_inputs, inputs);
        if (m_selected_inputs.size() != expected_count) {
            throw std::runtime_error(STR_INTERNAL_BUG("Shared UTXOs among selection results"));
        }
    }